

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O2

void Abc_NtkDumpEquivFile(char *pFileName,Vec_Int_t *vClasses,Abc_Ntk_t **pNtks)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  Abc_Obj_t *pObj;
  char *pcVar6;
  char *pcVar7;
  int i;
  uint local_40;
  
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    pcVar6 = (*pNtks)->pName;
    pcVar7 = pNtks[1]->pName;
    pcVar5 = Extra_TimeStamp();
    fprintf(__stream,"# Node equivalences computed by ABC for networks \"%s\" and \"%s\" on %s\n\n",
            pcVar6,pcVar7,pcVar5);
    local_40 = 0;
    for (iVar4 = 0; iVar4 < vClasses->nSize; iVar4 = iVar1 + iVar4) {
      iVar1 = iVar4 + 1;
      local_40 = local_40 + 1;
      i = iVar1;
      while( true ) {
        iVar2 = Vec_IntEntry(vClasses,iVar4);
        if (iVar2 + iVar1 <= i) break;
        uVar3 = Vec_IntEntry(vClasses,i);
        pNtk = pNtks[uVar3 & 1];
        pObj = Abc_NtkObj(pNtk,(int)uVar3 >> 2);
        pcVar6 = Abc_ObjName(pObj);
        pcVar7 = "NOT:";
        if ((uVar3 & 2) == 0) {
          pcVar7 = "";
        }
        fprintf(__stream,"%d:%s:%s%s\n",(ulong)local_40,pNtk->pName,pcVar7,pcVar6);
        i = i + 1;
      }
      fputc(10,__stream);
      iVar4 = Vec_IntEntry(vClasses,iVar4);
    }
    fclose(__stream);
    return;
  }
  printf("Cannot open file %s for writing.\n",pFileName);
  return;
}

Assistant:

void Abc_NtkDumpEquivFile( char * pFileName, Vec_Int_t * vClasses, Abc_Ntk_t * pNtks[2] )
{
    int i, c, k, Entry;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL ) { printf( "Cannot open file %s for writing.\n", pFileName ); return; }
    fprintf( pFile, "# Node equivalences computed by ABC for networks \"%s\" and \"%s\" on %s\n\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]), Extra_TimeStamp() );
    for ( i = c = 0; i < Vec_IntSize(vClasses); c++, i += 1 + Vec_IntEntry(vClasses, i) )
    {
        Vec_IntForEachEntryStartStop( vClasses, Entry, k, i + 1, i + 1 + Vec_IntEntry(vClasses, i) )
        {
            Abc_Ntk_t * pNtk = pNtks[Entry & 1];
            char * pObjName = Abc_ObjName( Abc_NtkObj(pNtk, Entry>>2) );
            fprintf( pFile, "%d:%s:%s%s\n", c+1, Abc_NtkName(pNtk), (Entry&2) ? "NOT:":"", pObjName );
        }
        fprintf( pFile, "\n" );
    }
    fclose( pFile );
}